

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

bool __thiscall
kj::Vector<kj::(anonymous_namespace)::TestCase3108::run()::CallbackEvent>::operator==
          (Vector<kj::(anonymous_namespace)::TestCase3108::run()::CallbackEvent> *this,
          ArrayPtr<const_CallbackEvent> *other)

{
  long lVar1;
  long lVar2;
  CallbackEvent *pCVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  
  lVar2 = *(long *)this;
  sVar4 = *(long *)(this + 8) - lVar2 >> 3;
  if (sVar4 != other->size_) {
    return false;
  }
  sVar5 = 0;
  while( true ) {
    bVar6 = sVar4 == sVar5;
    if (bVar6) {
      return bVar6;
    }
    if (*(uint *)(lVar2 + sVar5 * 8) != other->ptr[sVar5].runningCount) break;
    pCVar3 = other->ptr + sVar5;
    lVar1 = sVar5 * 8;
    sVar5 = sVar5 + 1;
    if (*(uint *)(lVar2 + 4 + lVar1) != pCVar3->pendingCount) {
      return bVar6;
    }
  }
  return bVar6;
}

Assistant:

inline ArrayPtr<const T> asPtr() const {
    return arrayPtr(ptr, pos);
  }